

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLCellLinOp.cpp
# Opt level: O2

Vector<double,_std::allocator<double>_> * __thiscall
amrex::MLCellLinOp::getSolvabilityOffset
          (Vector<double,_std::allocator<double>_> *__return_storage_ptr__,MLCellLinOp *this,
          int amrlev,int mglev,Any *a_rhs)

{
  long lVar1;
  uint uVar2;
  EBFArrayBoxFactory *this_00;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  Real RVar6;
  allocator_type local_41;
  MultiFab *local_40;
  MultiFab *local_38;
  
  local_40 = (MultiFab *)CONCAT44(local_40._4_4_,mglev);
  local_38 = Any::get<amrex::MultiFab>(a_rhs);
  computeVolInv(this);
  uVar2 = (*(this->super_MLLinOp)._vptr_MLLinOp[5])(this);
  std::vector<double,_std::allocator<double>_>::vector
            (&__return_storage_ptr__->super_vector<double,_std::allocator<double>_>,(long)(int)uVar2
             ,&local_41);
  lVar3 = (long)(int)local_40;
  lVar1 = *(long *)(*(long *)&(this->super_MLLinOp).m_factory.
                              super_vector<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
                              .
                              super__Vector_base<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[amrlev].
                              super_vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
                              .
                              super__Vector_base<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
                   + lVar3 * 8);
  if (lVar1 != 0) {
    uVar4 = 0;
    this_00 = (EBFArrayBoxFactory *)
              __dynamic_cast(lVar1,&FabFactory<amrex::FArrayBox>::typeinfo,
                             &EBFArrayBoxFactory::typeinfo);
    if (this_00 != (EBFArrayBoxFactory *)0x0) {
      local_40 = EBFArrayBoxFactory::getVolFrac(this_00);
      uVar5 = (ulong)uVar2;
      if ((int)uVar2 < 1) {
        uVar5 = uVar4;
      }
      for (; uVar5 != uVar4; uVar4 = uVar4 + 1) {
        RVar6 = MultiFab::Dot(local_38,(int)uVar4,local_40,0,1,0,true);
        (__return_storage_ptr__->super_vector<double,_std::allocator<double>_>).
        super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
        [uVar4] = RVar6 * *(double *)
                           (*(long *)&(this->m_volinv).
                                      super_vector<amrex::Vector<double,_std::allocator<double>_>,_std::allocator<amrex::Vector<double,_std::allocator<double>_>_>_>
                                      .
                                      super__Vector_base<amrex::Vector<double,_std::allocator<double>_>,_std::allocator<amrex::Vector<double,_std::allocator<double>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start[amrlev].
                                      super_vector<double,_std::allocator<double>_>.
                                      super__Vector_base<double,_std::allocator<double>_> +
                           lVar3 * 8);
      }
      return __return_storage_ptr__;
    }
  }
  uVar5 = 0;
  uVar4 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    uVar4 = uVar5;
  }
  for (; uVar4 != uVar5; uVar5 = uVar5 + 1) {
    RVar6 = MultiFab::sum(local_38,(int)uVar5,true);
    (__return_storage_ptr__->super_vector<double,_std::allocator<double>_>).
    super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
    [uVar5] = RVar6 * *(double *)
                       (*(long *)&(this->m_volinv).
                                  super_vector<amrex::Vector<double,_std::allocator<double>_>,_std::allocator<amrex::Vector<double,_std::allocator<double>_>_>_>
                                  .
                                  super__Vector_base<amrex::Vector<double,_std::allocator<double>_>,_std::allocator<amrex::Vector<double,_std::allocator<double>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[amrlev].
                                  super_vector<double,_std::allocator<double>_>.
                                  super__Vector_base<double,_std::allocator<double>_> + lVar3 * 8);
  }
  return __return_storage_ptr__;
}

Assistant:

Vector<Real>
MLCellLinOp::getSolvabilityOffset (int amrlev, int mglev, Any const& a_rhs) const
{
    AMREX_ASSERT(a_rhs.is<MultiFab>());
    auto const& rhs = a_rhs.get<MultiFab>();

    computeVolInv();

    const int ncomp = getNComp();
    Vector<Real> offset(ncomp);

#ifdef AMREX_USE_EB
    auto factory = dynamic_cast<EBFArrayBoxFactory const*>(Factory(amrlev,mglev));
    if (factory)
    {
        const MultiFab& vfrac = factory->getVolFrac();
        for (int c = 0; c < ncomp; ++c) {
            offset[c] = MultiFab::Dot(rhs, c, vfrac, 0, 1, 0, true) * m_volinv[amrlev][mglev];
        }
    }
    else
#endif
    {
        for (int c = 0; c < ncomp; ++c) {
            offset[c] = rhs.sum(c,true) * m_volinv[amrlev][mglev];
        }
    }

    ParallelAllReduce::Sum(offset.data(), ncomp, ParallelContext::CommunicatorSub());

    return offset;
}